

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O3

void __thiscall
helix::parity::pmd_handler::process_msg(pmd_handler *this,pmd_order_deleted *m,bool sync)

{
  uint uVar1;
  ulong uVar2;
  order_book *this_00;
  iterator iVar3;
  undefined8 uVar4;
  uint64_t timestamp;
  uint64_t order_id;
  char *local_68;
  event local_60;
  
  uVar2 = m->OrderNumber;
  local_68 = (char *)(uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                      (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                      (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                      (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38);
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book_&>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_order_id_map)._M_h,(key_type *)&local_68);
  if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>.
      _M_cur != (__node_type *)0x0) {
    this_00 = *(order_book **)
               ((long)iVar3.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>
                      ._M_cur + 0x10);
    uVar1 = m->Timestamp;
    timestamp = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18) / 1000000 + (ulong)(this->_seconds * 1000);
    order_book::remove(this_00,local_68);
    this_00->_timestamp = timestamp;
    if (sync) {
      make_ob_event(&local_60,&this_00->_symbol,timestamp,this_00,0);
      if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar4 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
          operator_delete(local_60._symbol._M_dataplus._M_p,
                          local_60._symbol.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar4);
      }
      (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._symbol._M_dataplus._M_p != &local_60._symbol.field_2) {
        operator_delete(local_60._symbol._M_dataplus._M_p,
                        local_60._symbol.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void pmd_handler::process_msg(const pmd_order_deleted* m, bool sync)
{
    uint64_t order_id = be64toh(m->OrderNumber);
    auto it = _order_id_map.find(order_id);
    if (it != _order_id_map.end()) {
        auto& ob = it->second;
        uint64_t timestamp = to_timestamp(be32toh(m->Timestamp));
        ob.remove(order_id);
        ob.set_timestamp(timestamp);
        if (sync) {
            _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
        }
    }
}